

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O3

int GetMaxLabelLength(void *hPtr)

{
  int32_t iVar1;
  int iVar2;
  int lid;
  string label;
  shared_ptr<const_fasttext::Dictionary> dict;
  string local_58;
  Dictionary *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  fasttext::FastText::getDictionary((FastText *)hPtr);
  iVar1 = fasttext::Dictionary::nlabels(local_38);
  if (iVar1 < 1) {
    iVar2 = 0;
  }
  else {
    lid = 0;
    iVar2 = 0;
    do {
      fasttext::Dictionary::getLabel_abi_cxx11_(&local_58,local_38,lid);
      if ((ulong)(long)iVar2 < local_58._M_string_length) {
        iVar2 = (int)local_58._M_string_length;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      lid = lid + 1;
    } while (iVar1 != lid);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return iVar2;
}

Assistant:

GetMaxLabelLength(void* hPtr)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    auto dict = fastText->getDictionary();
    int numLabels = dict->nlabels();
    int maxLen = 0;

    try {
        for (int i = 0; i < numLabels; ++i)
        {
            auto label = dict->getLabel(i);
            if (label.length() > maxLen)
            {
                maxLen = label.length();
            }
        }

        return maxLen;
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }
}